

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 ImGui::NavCalcPreferredRefPos(void)

{
  ImVec2 *mouse_pos;
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImGuiWindow *window;
  undefined1 auVar3 [16];
  ImGuiContext *pIVar4;
  bool bVar5;
  ImGuiViewport *pIVar6;
  ImVec2 *pIVar7;
  uint uVar8;
  float fVar9;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  float fVar10;
  float fVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  pIVar4 = GImGui;
  if ((GImGui->NavDisableHighlight == false) &&
     (window = GImGui->NavWindow, (GImGui->NavDisableMouseHover & window != (ImGuiWindow *)0x0) != 0
     )) {
    IVar1 = (window->DC).CursorStartPos;
    local_38 = IVar1.x;
    fStack_34 = IVar1.y;
    IVar1 = window->NavRectRel[GImGui->NavLayer].Min;
    IVar2 = window->NavRectRel[GImGui->NavLayer].Max;
    local_48 = IVar1.x + local_38;
    fStack_44 = IVar1.y + fStack_34;
    local_38 = IVar2.x + local_38;
    fStack_34 = IVar2.y + fStack_34;
    fStack_30 = 0.0;
    fStack_2c = 0.0;
    fStack_40 = 0.0;
    fStack_3c = 0.0;
    if ((window->LastFrameActive != GImGui->FrameCount) &&
       ((((fVar10 = (window->ScrollTarget).x, fVar10 != 3.4028235e+38 || (NAN(fVar10))) ||
         (fVar10 = (window->ScrollTarget).y, fVar10 != 3.4028235e+38)) || (NAN(fVar10))))) {
      IVar1 = CalcNextScrollFromScrollTargetAndClamp(window);
      fVar10 = (window->Scroll).x - IVar1.x;
      fVar12 = (window->Scroll).y - IVar1.y;
      local_48 = local_48 + fVar10;
      fStack_44 = fStack_44 + fVar12;
      fStack_40 = (0.0 - extraout_XMM0_Dc) + 0.0;
      fStack_3c = (0.0 - extraout_XMM0_Dd) + 0.0;
      local_38 = local_38 + fVar10;
      fStack_34 = fStack_34 + fVar12;
      fStack_30 = (0.0 - extraout_XMM0_Dc) + 0.0;
      fStack_2c = (0.0 - extraout_XMM0_Dd) + 0.0;
    }
    auVar3._4_4_ = (pIVar4->Style).FramePadding.y;
    auVar3._0_4_ = (pIVar4->Style).FramePadding.x * 4.0;
    pIVar6 = GetMainViewport();
    auVar3._8_8_ = 0;
    auVar14._4_4_ = fStack_34 - fStack_44;
    auVar14._0_4_ = local_38 - local_48;
    auVar14._8_4_ = fStack_30 - fStack_40;
    auVar14._12_4_ = fStack_2c - fStack_3c;
    auVar14 = minps(auVar3,auVar14);
    local_48 = local_48 + auVar14._0_4_;
    auVar13._4_4_ = fStack_34 - auVar14._4_4_;
    auVar13._0_4_ = local_48;
    auVar13._8_4_ = fStack_40 + auVar14._8_4_;
    auVar13._12_4_ = fStack_3c + auVar14._12_4_;
    fVar10 = (pIVar6->Pos).x;
    fVar9 = (pIVar6->Pos).y;
    auVar11._0_4_ = (pIVar6->Size).x + fVar10;
    auVar11._4_4_ = (pIVar6->Size).y + fVar9;
    auVar11._8_8_ = 0;
    auVar14 = minps(auVar11,auVar13);
    uVar8 = -(uint)(local_48 < fVar10);
    fVar12 = (float)(int)(float)(~uVar8 & auVar14._0_4_ | (uint)fVar10 & uVar8);
    fVar10 = (float)(int)(float)(~-(uint)(auVar13._4_4_ < fVar9) & auVar14._4_4_ |
                                (uint)fVar9 & -(uint)(auVar13._4_4_ < fVar9));
  }
  else {
    mouse_pos = &(GImGui->IO).MousePos;
    bVar5 = IsMousePosValid(mouse_pos);
    pIVar7 = &pIVar4->MouseLastValidPos;
    if (bVar5) {
      pIVar7 = mouse_pos;
    }
    fVar12 = pIVar7->x + 1.0;
    fVar10 = pIVar7->y;
  }
  IVar1.y = fVar10;
  IVar1.x = fVar12;
  return IVar1;
}

Assistant:

static ImVec2 ImGui::NavCalcPreferredRefPos()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.NavWindow;
    if (g.NavDisableHighlight || !g.NavDisableMouseHover || !window)
    {
        // Mouse (we need a fallback in case the mouse becomes invalid after being used)
        // The +1.0f offset when stored by OpenPopupEx() allows reopening this or another popup (same or another mouse button) while not moving the mouse, it is pretty standard.
        // In theory we could move that +1.0f offset in OpenPopupEx()
        ImVec2 p = IsMousePosValid(&g.IO.MousePos) ? g.IO.MousePos : g.MouseLastValidPos;
        return ImVec2(p.x + 1.0f, p.y);
    }
    else
    {
        // When navigation is active and mouse is disabled, pick a position around the bottom left of the currently navigated item
        // Take account of upcoming scrolling (maybe set mouse pos should be done in EndFrame?)
        ImRect rect_rel = WindowRectRelToAbs(window, window->NavRectRel[g.NavLayer]);
        if (window->LastFrameActive != g.FrameCount && (window->ScrollTarget.x != FLT_MAX || window->ScrollTarget.y != FLT_MAX))
        {
            ImVec2 next_scroll = CalcNextScrollFromScrollTargetAndClamp(window);
            rect_rel.Translate(window->Scroll - next_scroll);
        }
        ImVec2 pos = ImVec2(rect_rel.Min.x + ImMin(g.Style.FramePadding.x * 4, rect_rel.GetWidth()), rect_rel.Max.y - ImMin(g.Style.FramePadding.y, rect_rel.GetHeight()));
        ImGuiViewport* viewport = GetMainViewport();
        return ImFloor(ImClamp(pos, viewport->Pos, viewport->Pos + viewport->Size)); // ImFloor() is important because non-integer mouse position application in backend might be lossy and result in undesirable non-zero delta.
    }
}